

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple_management.hpp
# Opt level: O0

enable_if_t<_std::is_copy_constructible<unique_ptr<int>_>::value>
burst::management::copy<std::unique_ptr<int,std::default_delete<int>>>(void *param_1,void *param_2)

{
  runtime_error *this;
  string local_d0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  ctti_type_index local_40;
  undefined1 local_38 [8];
  string type_name;
  void *param_1_local;
  void *param_0_local;
  
  type_name.field_2._8_8_ = param_2;
  local_40 = boost::typeindex::ctti_type_index::
             type_id<std::unique_ptr<int,std::default_delete<int>>>();
  boost::typeindex::ctti_type_index::pretty_name_abi_cxx11_((string *)local_38,&local_40);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  literals::operator____u8s_abi_cxx11_(&local_a0,anon_var_dwarf_2002a4,0x16);
  std::operator+(&local_80,&local_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  literals::operator____u8s_abi_cxx11_(&local_d0,anon_var_dwarf_2002af,0x15);
  std::operator+(&local_60,&local_80,&local_d0);
  std::runtime_error::runtime_error(this,(string *)&local_60);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

auto copy (const void *, void *)
            ->
                std::enable_if_t
                <
                    not std::is_copy_constructible<T>::value
                >
        {
            auto type_name = boost::typeindex::ctti_type_index::type_id<T>().pretty_name();
            using literals::operator ""_u8s;
            throw std::runtime_error(u8"Объект типа "_u8s + type_name + u8" некопируем"_u8s);
        }